

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O0

bool woff2::anon_unknown_3::WriteNormalizedLoca(int index_fmt,int num_glyphs,Font *font)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_type sVar4;
  unsigned_long uVar5;
  uint8_t *local_100;
  reference local_f8;
  reference local_d8;
  unsigned_long local_c8;
  size_t glyf_dst_size;
  size_t local_b0;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  size_t sStack_58;
  int i;
  size_t loca_offset;
  reference pvStack_48;
  uint32_t glyf_offset;
  uint8_t *loca_dst;
  uint8_t *glyf_dst;
  Table *pTStack_30;
  int glyph_sz;
  Table *loca_table;
  Table *glyf_table;
  Font *font_local;
  int local_10;
  int num_glyphs_local;
  int index_fmt_local;
  
  glyf_table = (Table *)font;
  font_local._4_4_ = num_glyphs;
  local_10 = index_fmt;
  loca_table = Font::FindTable(font,0x676c7966);
  pTStack_30 = Font::FindTable((Font *)glyf_table,0x6c6f6361);
  glyf_dst._4_4_ = 4;
  if (local_10 == 0) {
    glyf_dst._4_4_ = 2;
  }
  this = &pTStack_30->buffer;
  iVar2 = Round4<int>(font_local._4_4_ + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this,(long)(iVar2 * glyf_dst._4_4_));
  pTStack_30->length = (font_local._4_4_ + 1) * glyf_dst._4_4_;
  if (font_local._4_4_ == 0) {
    local_d8 = (reference)0x0;
  }
  else {
    local_d8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&loca_table->buffer,0);
  }
  loca_dst = local_d8;
  pvStack_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pTStack_30->buffer,0);
  loca_offset._4_4_ = 0;
  sStack_58 = 0;
  glyph.have_instructions = false;
  glyph._61_3_ = 0;
  for (; (int)glyph._60_4_ < font_local._4_4_; glyph._60_4_ = glyph._60_4_ + 1) {
    StoreLoca(local_10,loca_offset._4_4_,&stack0xffffffffffffffa8,pvStack_48);
    Glyph::Glyph((Glyph *)&glyph_data);
    bVar1 = GetGlyphData((Font *)glyf_table,glyph._60_4_,(uint8_t **)&glyph_size,&local_b0);
    if ((bVar1) &&
       ((local_b0 == 0 ||
        (bVar1 = ReadGlyph((uint8_t *)glyph_size,local_b0,(Glyph *)&glyph_data), bVar1)))) {
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&loca_table->buffer);
      local_c8 = sVar4 - loca_offset._4_4_;
      bVar1 = StoreGlyph((Glyph *)&glyph_data,loca_dst + loca_offset._4_4_,&local_c8);
      if (bVar1) {
        uVar5 = Round4<unsigned_long>(local_c8);
        local_c8 = uVar5;
        uVar3 = std::numeric_limits<unsigned_int>::max();
        if (((uVar3 < uVar5) || (loca_offset._4_4_ + (int)local_c8 < loca_offset._4_4_)) ||
           ((local_10 == 0 && (0x1ffff < loca_offset._4_4_ + local_c8)))) {
          num_glyphs_local._3_1_ = 0;
          glyf_dst_size._0_4_ = 1;
        }
        else {
          loca_offset._4_4_ = loca_offset._4_4_ + (int)local_c8;
          glyf_dst_size._0_4_ = 0;
        }
      }
      else {
        num_glyphs_local._3_1_ = 0;
        glyf_dst_size._0_4_ = 1;
      }
    }
    else {
      num_glyphs_local._3_1_ = 0;
      glyf_dst_size._0_4_ = 1;
    }
    Glyph::~Glyph((Glyph *)&glyph_data);
    if ((int)glyf_dst_size != 0) goto LAB_00132c21;
  }
  StoreLoca(local_10,loca_offset._4_4_,&stack0xffffffffffffffa8,pvStack_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&loca_table->buffer,(ulong)loca_offset._4_4_);
  if (loca_offset._4_4_ == 0) {
    local_f8 = (reference)0x0;
  }
  else {
    local_f8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&loca_table->buffer,0);
  }
  loca_table->data = local_f8;
  loca_table->length = loca_offset._4_4_;
  if (sStack_58 == 0) {
    local_100 = (uint8_t *)0x0;
  }
  else {
    local_100 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (&pTStack_30->buffer,0);
  }
  pTStack_30->data = local_100;
  num_glyphs_local._3_1_ = 1;
LAB_00132c21:
  return (bool)(num_glyphs_local._3_1_ & 1);
}

Assistant:

bool WriteNormalizedLoca(int index_fmt, int num_glyphs, Font* font) {
  Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  Font::Table* loca_table = font->FindTable(kLocaTableTag);

  int glyph_sz = index_fmt == 0 ? 2 : 4;
  loca_table->buffer.resize(Round4(num_glyphs + 1) * glyph_sz);
  loca_table->length = (num_glyphs + 1) * glyph_sz;

  uint8_t* glyf_dst = num_glyphs ? &glyf_table->buffer[0] : NULL;
  uint8_t* loca_dst = &loca_table->buffer[0];
  uint32_t glyf_offset = 0;
  size_t loca_offset = 0;

  for (int i = 0; i < num_glyphs; ++i) {
    StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    size_t glyf_dst_size = glyf_table->buffer.size() - glyf_offset;
    if (!StoreGlyph(glyph, glyf_dst + glyf_offset, &glyf_dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_dst_size = Round4(glyf_dst_size);
    if (glyf_dst_size > std::numeric_limits<uint32_t>::max() ||
        glyf_offset + static_cast<uint32_t>(glyf_dst_size) < glyf_offset ||
        (index_fmt == 0 && glyf_offset + glyf_dst_size >= (1UL << 17))) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_offset += glyf_dst_size;
  }

  StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);

  glyf_table->buffer.resize(glyf_offset);
  glyf_table->data = glyf_offset ? &glyf_table->buffer[0] : NULL;
  glyf_table->length = glyf_offset;
  loca_table->data = loca_offset ? &loca_table->buffer[0] : NULL;

  return true;
}